

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::HandleDiagGetAnswer(CommissionerImpl *this,Request *aRequest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  type tVar3;
  char *pcVar4;
  char *pcVar5;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  Error error;
  writer write;
  string peerAddr;
  undefined1 local_108 [8];
  _Alloc_hider _Stack_100;
  undefined1 local_f8 [24];
  code *local_e0;
  string local_d0;
  string local_b0;
  type local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  writer local_68;
  pointer puStack_60;
  string local_50;
  
  local_88 = local_78;
  local_90 = 0;
  local_80 = 0;
  local_78[0] = 0;
  (*aRequest->mEndpoint->_vptr_Endpoint[3])(local_108);
  Address::ToString_abi_cxx11_(&local_50,(Address *)local_108);
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"meshdiag","");
  local_108._0_4_ = 0xd;
  _Stack_100._M_p = "received DIAG_GET.ans from {}";
  local_f8._0_8_ = (pointer)0x1d;
  local_f8._8_8_ = 0x100000000;
  local_e0 = ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  pcVar5 = "received DIAG_GET.ans from {}";
  local_f8._16_8_ = local_108;
  do {
    pcVar4 = pcVar5 + 1;
    if (*pcVar5 == '}') {
      if ((pcVar4 == "") || (*pcVar4 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar4 = pcVar5 + 2;
    }
    else if (*pcVar5 == '{') {
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar5,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_108);
    }
    pcVar5 = pcVar4;
  } while (pcVar4 != "");
  local_108 = (undefined1  [8])local_50._M_dataplus._M_p;
  _Stack_100._M_p = (pointer)local_50._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x1d;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_108;
  ::fmt::v10::vformat_abi_cxx11_(&local_d0,(v10 *)"received DIAG_GET.ans from {}",fmt,args);
  Log(kInfo,&local_b0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  ProxyClient::SendEmptyChanged(&this->mProxyClient,aRequest);
  internal::DecodeNetDiagData((Error *)local_108,&this->mDiagAnsTlvs,&aRequest->mPayload);
  local_90 = local_108._0_4_;
  std::__cxx11::string::operator=((string *)&local_88,(string *)&_Stack_100);
  tVar3 = local_90;
  if (_Stack_100._M_p != local_f8 + 8) {
    operator_delete(_Stack_100._M_p);
  }
  paVar1 = &local_b0.field_2;
  if (tVar3 == none_type) {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"meshdiag","");
    local_108._0_4_ = 0xd;
    _Stack_100._M_p = "accepted DIAG_GET.ans data {}";
    local_f8._0_8_ = (pointer)0x1d;
    local_f8._8_8_ = 0x100000000;
    local_e0 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    aBytes = extraout_RDX;
    pcVar5 = "accepted DIAG_GET.ans data {}";
    local_f8._16_8_ = local_108;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_108);
        aBytes = extraout_RDX_00;
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    utils::Hex_abi_cxx11_((string *)local_108,(utils *)&aRequest->mPayload,aBytes);
    local_68.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_108;
    puStack_60 = (pointer)_Stack_100._M_p;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x1d;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_d0,(v10 *)"accepted DIAG_GET.ans data {}",fmt_00,args_00);
    Log(kInfo,&local_b0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    (*this->mCommissionerHandler->_vptr_CommissionerHandler[6])
              (this->mCommissionerHandler,&local_50,&this->mDiagAnsTlvs);
  }
  if (local_90 != none_type) {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"meshdiag","");
    local_108._0_4_ = 0xd;
    pcVar5 = "failed to handle DIAG_GET.ans from {}";
    _Stack_100._M_p = "failed to handle DIAG_GET.ans from {}";
    local_f8._0_8_ = (pointer)0x25;
    local_f8._8_8_ = 0x100000000;
    local_e0 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_f8._16_8_ = local_108;
    local_68.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_108;
    do {
      cVar2 = *pcVar5;
      pcVar4 = pcVar5;
      while (cVar2 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&local_68,pcVar5,"");
          goto LAB_0015cf08;
        }
        cVar2 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&local_68,pcVar5,pcVar4);
      pcVar5 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_108);
    } while (pcVar5 != "");
LAB_0015cf08:
    local_108 = (undefined1  [8])local_50._M_dataplus._M_p;
    _Stack_100._M_p = (pointer)local_50._M_string_length;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = (char *)0x25;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_108;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_d0,(v10 *)"failed to handle DIAG_GET.ans from {}",fmt_01,args_01);
    Log(kError,&local_b0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

void CommissionerImpl::HandleDiagGetAnswer(const coap::Request &aRequest)
{
    Error       error;
    std::string peerAddr = aRequest.GetEndpoint()->GetPeerAddr().ToString();

    LOG_INFO(LOG_REGION_MESHDIAG, "received DIAG_GET.ans from {}", peerAddr);
    mProxyClient.SendEmptyChanged(aRequest);

    SuccessOrExit(error = internal::DecodeNetDiagData(mDiagAnsTlvs, aRequest.GetPayload()));
    LOG_INFO(LOG_REGION_MESHDIAG, "accepted DIAG_GET.ans data {}", utils::Hex(aRequest.GetPayload()));

    mCommissionerHandler.OnDiagGetAnswerMessage(peerAddr, mDiagAnsTlvs);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_MESHDIAG, "failed to handle DIAG_GET.ans from {}", peerAddr);
    }
}